

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::genRenderbuffers(GLContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  deUint32 *renderbuffers_local;
  int numRenderbuffers_local;
  GLContext *this_local;
  
  glu::CallLogWrapper::glGenRenderbuffers(this->m_wrapper,numRenderbuffers,renderbuffers);
  if (0 < numRenderbuffers) {
    std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
    insert<unsigned_int*>
              ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)
               &this->m_allocatedRbos,renderbuffers,renderbuffers + numRenderbuffers);
  }
  return;
}

Assistant:

void GLContext::genRenderbuffers (int numRenderbuffers, deUint32* renderbuffers)
{
	m_wrapper->glGenRenderbuffers(numRenderbuffers, renderbuffers);
	if (numRenderbuffers > 0)
		m_allocatedRbos.insert(renderbuffers, renderbuffers+numRenderbuffers);
}